

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-netcdf-cursor.c
# Opt level: O1

int coda_netcdf_cursor_goto_next_array_element(coda_cursor_conflict *cursor)

{
  long *plVar1;
  long lVar2;
  coda_type *pcVar3;
  long lVar4;
  long in_FS_OFFSET;
  
  if (*(int *)(in_FS_OFFSET + -0x1208) != 0) {
    lVar2 = cursor->stack[(long)cursor->n + -1].index;
    pcVar3 = (cursor->stack[(long)cursor->n + -2].type)->definition;
    lVar4._0_4_ = pcVar3[1].type_class;
    lVar4._4_4_ = pcVar3[1].read_type;
    if ((lVar2 < -1) || (lVar4 <= lVar2 + 1)) {
      coda_set_error(-0x6b,"array index (%ld) exceeds array range [0:%ld)");
      return -1;
    }
  }
  plVar1 = &cursor->stack[(long)cursor->n + -1].index;
  *plVar1 = *plVar1 + 1;
  return 0;
}

Assistant:

int coda_netcdf_cursor_goto_next_array_element(coda_cursor *cursor)
{
    if (coda_option_perform_boundary_checks)
    {
        long num_elements;
        long index;

        index = cursor->stack[cursor->n - 1].index + 1;
        num_elements = ((coda_type_array *)cursor->stack[cursor->n - 2].type->definition)->num_elements;
        if (index < 0 || index >= num_elements)
        {
            coda_set_error(CODA_ERROR_ARRAY_OUT_OF_BOUNDS, "array index (%ld) exceeds array range [0:%ld)", index,
                           num_elements);
            return -1;
        }
    }

    cursor->stack[cursor->n - 1].index++;

    return 0;
}